

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Builder * __thiscall
capnp::Orphan<capnp::DynamicList>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicList> *this)

{
  uint8_t uVar1;
  anon_union_8_2_eba6ea51_for_Type_5 aVar2;
  SegmentBuilder *pSVar3;
  CapTableBuilder *pCVar4;
  StructPointerCount SVar5;
  undefined1 uVar6;
  ListElementCount LVar7;
  BitsPerElementN<23> BVar8;
  Which WVar9;
  uint8_t uVar10;
  bool bVar11;
  anon_union_2_2_d12d5221_for_Type_3 aVar12;
  undefined2 uVar13;
  ElementSize EVar14;
  uint uVar15;
  Which elementType;
  uint uVar16;
  ListBuilder *__return_storage_ptr___00;
  Schema local_b0;
  ListBuilder local_a8;
  ListBuilder local_80;
  Reader local_58;
  
  uVar1 = (this->schema).elementType.listDepth;
  WVar9 = (this->schema).elementType.baseType;
  uVar10 = (this->schema).elementType.listDepth;
  bVar11 = (this->schema).elementType.isImplicitParam;
  aVar12 = (this->schema).elementType.field_3;
  uVar13 = *(undefined2 *)&(this->schema).elementType.field_0x6;
  aVar2 = (this->schema).elementType.field_4;
  if ((uVar1 == '\0') && ((this->schema).elementType.baseType == STRUCT)) {
    local_b0.raw = (RawBrandedSchema *)Type::asStruct((Type *)this);
    Schema::getProto(&local_58,&local_b0);
    uVar16 = 0;
    uVar15 = 0;
    if (0x7f < local_58._reader.dataSize) {
      uVar15 = (uint)*(ushort *)((long)local_58._reader.data + 0xe);
    }
    if (0xcf < local_58._reader.dataSize) {
      uVar16 = (uint)*(ushort *)((long)local_58._reader.data + 0x18) << 0x10;
    }
    __return_storage_ptr___00 = &local_80;
    capnp::_::OrphanBuilder::asStructList
              (__return_storage_ptr___00,&this->builder,(StructSize)(uVar16 | uVar15));
  }
  else {
    elementType = LIST;
    if (uVar1 == '\0') {
      elementType = (this->schema).elementType.baseType;
    }
    EVar14 = anon_unknown_71::elementSizeFor(elementType);
    __return_storage_ptr___00 = &local_a8;
    capnp::_::OrphanBuilder::asList(__return_storage_ptr___00,&this->builder,EVar14);
  }
  SVar5 = __return_storage_ptr___00->structPointerCount;
  EVar14 = __return_storage_ptr___00->elementSize;
  uVar6 = __return_storage_ptr___00->field_0x27;
  (__return_storage_ptr__->builder).structDataSize = __return_storage_ptr___00->structDataSize;
  (__return_storage_ptr__->builder).structPointerCount = SVar5;
  (__return_storage_ptr__->builder).elementSize = EVar14;
  (__return_storage_ptr__->builder).field_0x27 = uVar6;
  pSVar3 = __return_storage_ptr___00->segment;
  pCVar4 = __return_storage_ptr___00->capTable;
  LVar7 = __return_storage_ptr___00->elementCount;
  BVar8 = __return_storage_ptr___00->step;
  (__return_storage_ptr__->builder).ptr = __return_storage_ptr___00->ptr;
  (__return_storage_ptr__->builder).elementCount = LVar7;
  (__return_storage_ptr__->builder).step = BVar8;
  (__return_storage_ptr__->builder).segment = pSVar3;
  (__return_storage_ptr__->builder).capTable = pCVar4;
  (__return_storage_ptr__->schema).elementType.baseType = WVar9;
  (__return_storage_ptr__->schema).elementType.listDepth = uVar10;
  (__return_storage_ptr__->schema).elementType.isImplicitParam = bVar11;
  (__return_storage_ptr__->schema).elementType.field_3 = aVar12;
  *(undefined2 *)&(__return_storage_ptr__->schema).elementType.field_0x6 = uVar13;
  (__return_storage_ptr__->schema).elementType.field_4 = aVar2;
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Builder Orphan<DynamicList>::get() {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return DynamicList::Builder(
        schema, builder.asStructList(structSizeFromSchema(schema.getStructElementType())));
  } else {
    return DynamicList::Builder(
        schema, builder.asList(elementSizeFor(schema.whichElementType())));
  }
}